

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuX11GlxPlatform.cpp
# Opt level: O2

void __thiscall tcu::x11::glx::GlxRenderContext::makeCurrent(GlxRenderContext *this)

{
  int iVar1;
  int line;
  
  iVar1 = (*((this->m_glxDrawable).
             super_UniqueBase<tcu::x11::glx::GlxDrawable,_de::DefaultDeleter<tcu::x11::glx::GlxDrawable>_>
             .m_data.ptr)->_vptr_GlxDrawable[5])();
  line = (int)this->m_GLXContext;
  iVar1 = glXMakeContextCurrent((this->m_glxDisplay).super_XlibDisplay.m_display,iVar1,iVar1);
  checkGLX<int>(iVar1,
                "glXMakeContextCurrent(m_glxDisplay.getXDisplay(), drawRead, drawRead, m_GLXContext)"
                ,(char *)0x2bf,line);
  return;
}

Assistant:

void GlxRenderContext::makeCurrent (void)
{
	const GLXDrawable drawRead = m_glxDrawable->getGLXDrawable();
	TCU_CHECK_GLX(glXMakeContextCurrent(m_glxDisplay.getXDisplay(),
										drawRead, drawRead, m_GLXContext));
}